

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O3

void __thiscall ThreadedReplayer::enqueue_work_item(ThreadedReplayer *this,PipelineWorkItem *item)

{
  iterator *piVar1;
  _Elt_pointer pPVar2;
  Hash HVar3;
  anon_union_8_4_a74ac663_for_create_info aVar4;
  anon_union_8_2_967b01e7_for_hash_map_entry aVar5;
  uint uVar6;
  bool bVar7;
  bool bVar8;
  undefined2 uVar9;
  ResourceTag RVar10;
  uint uVar11;
  int iVar12;
  
  iVar12 = pthread_mutex_lock((pthread_mutex_t *)&this->pipeline_work_queue_mutex);
  if (iVar12 == 0) {
    pPVar2 = (this->pipeline_work_queue).c.
             super__Deque_base<PipelineWorkItem,_std::allocator<PipelineWorkItem>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pPVar2 == (this->pipeline_work_queue).c.
                  super__Deque_base<PipelineWorkItem,_std::allocator<PipelineWorkItem>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<PipelineWorkItem,std::allocator<PipelineWorkItem>>::
      _M_push_back_aux<PipelineWorkItem_const&>
                ((deque<PipelineWorkItem,std::allocator<PipelineWorkItem>> *)
                 &this->pipeline_work_queue,item);
    }
    else {
      HVar3 = item->hash;
      RVar10 = item->tag;
      uVar11 = item->index;
      uVar6 = item->memory_context_index;
      bVar7 = item->parse_only;
      bVar8 = item->force_outside_range;
      uVar9 = *(undefined2 *)&item->field_0x16;
      aVar4 = item->create_info;
      aVar5 = item->hash_map_entry;
      pPVar2->output = item->output;
      pPVar2->hash_map_entry = aVar5;
      pPVar2->memory_context_index = uVar6;
      pPVar2->parse_only = bVar7;
      pPVar2->force_outside_range = bVar8;
      *(undefined2 *)&pPVar2->field_0x16 = uVar9;
      pPVar2->create_info = aVar4;
      pPVar2->hash = HVar3;
      pPVar2->tag = RVar10;
      pPVar2->index = uVar11;
      piVar1 = &(this->pipeline_work_queue).c.
                super__Deque_base<PipelineWorkItem,_std::allocator<PipelineWorkItem>_>._M_impl.
                super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    std::condition_variable::notify_one();
    this->queued_count[item->memory_context_index] =
         this->queued_count[item->memory_context_index] + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->pipeline_work_queue_mutex);
    return;
  }
  std::__throw_system_error(iVar12);
}

Assistant:

void enqueue_work_item(const PipelineWorkItem &item)
	{
		lock_guard<mutex> lock(pipeline_work_queue_mutex);
		pipeline_work_queue.push(item);
		work_available_condition.notify_one();
		queued_count[item.memory_context_index]++;
	}